

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<const_trust_token_method_st_*,_bool> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
  *in_RSI;
  ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_> PVar1;
  
  this_00 = (CartesianProductGenerator<const_trust_token_method_st_*,_bool> *)operator_new(0x28);
  CartesianProductGenerator<const_trust_token_method_st_*,_bool>::CartesianProductGenerator
            (this_00,in_RSI);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<trust_token_method_st_const*,bool>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<trust_token_method_st_const*,bool>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<trust_token_method_st_const*,bool>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *)
                     this_00);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }